

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderCodeVariableDescX::ShaderCodeVariableDescX
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDesc *Member)

{
  char *pcVar1;
  SHADER_CODE_BASIC_TYPE SVar2;
  Uint8 UVar3;
  Uint8 UVar4;
  Uint32 UVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  char *pcVar8;
  Uint32 i;
  ulong uVar9;
  long lVar10;
  allocator local_22;
  allocator local_21;
  
  (this->super_ShaderCodeVariableDesc).pMembers = Member->pMembers;
  pcVar8 = Member->Name;
  pcVar1 = Member->TypeName;
  SVar2 = Member->BasicType;
  UVar3 = Member->NumRows;
  UVar4 = Member->NumColumns;
  UVar5 = Member->Offset;
  UVar6 = Member->ArraySize;
  UVar7 = Member->NumMembers;
  (this->super_ShaderCodeVariableDesc).Class = Member->Class;
  (this->super_ShaderCodeVariableDesc).BasicType = SVar2;
  (this->super_ShaderCodeVariableDesc).NumRows = UVar3;
  (this->super_ShaderCodeVariableDesc).NumColumns = UVar4;
  (this->super_ShaderCodeVariableDesc).Offset = UVar5;
  (this->super_ShaderCodeVariableDesc).ArraySize = UVar6;
  (this->super_ShaderCodeVariableDesc).NumMembers = UVar7;
  (this->super_ShaderCodeVariableDesc).Name = pcVar8;
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar1;
  pcVar8 = Member->Name;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "";
  }
  std::__cxx11::string::string((string *)&this->NameCopy,pcVar8,&local_21);
  pcVar8 = "";
  if (Member->TypeName != (char *)0x0) {
    pcVar8 = Member->TypeName;
  }
  std::__cxx11::string::string((string *)&this->TypeNameCopy,pcVar8,&local_22);
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ShaderCodeVariableDesc).Name = (this->NameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::reserve(&this->Members,(ulong)Member->NumMembers);
  lVar10 = 0;
  for (uVar9 = 0; uVar9 < Member->NumMembers; uVar9 = uVar9 + 1) {
    AddMember(this,(ShaderCodeVariableDesc *)((long)&Member->pMembers->Name + lVar10));
    lVar10 = lVar10 + 0x28;
  }
  return;
}

Assistant:

ShaderCodeVariableDescX(const ShaderCodeVariableDesc& Member) noexcept :
        ShaderCodeVariableDesc{Member},
        // clang-format off
        NameCopy    {Member.Name     != nullptr ? Member.Name     : ""},
        TypeNameCopy{Member.TypeName != nullptr ? Member.TypeName : ""}
    // clang-format on
    {
        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();

        Members.reserve(Member.NumMembers);
        for (Uint32 i = 0; i < Member.NumMembers; ++i)
            AddMember(Member.pMembers[i]);
    }